

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartialsByPartition
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  float *pfVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  float fVar12;
  double dVar13;
  undefined1 auVar14 [16];
  float fVar15;
  uint local_38;
  
  piVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternPartitionsStartPatterns;
  iVar11 = piVar3[partitionIndex];
  lVar10 = (long)iVar11;
  iVar2 = piVar3[(long)partitionIndex + 1];
  if (iVar11 < iVar2) {
    lVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).kFlags;
    iVar11 = iVar11 * 4;
    do {
      iVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
      auVar14 = ZEXT816(0) << 0x40;
      if (0 < iVar7) {
        iVar8 = iVar7;
        iVar9 = iVar11;
        do {
          auVar14 = vmaxss_avx(ZEXT416((uint)destP[iVar9]),auVar14);
          auVar14 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar9 + 1]),auVar14);
          auVar14 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar9 + 2]),auVar14);
          auVar14 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar9 + 3]),auVar14);
          iVar9 = iVar9 + (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar5 = vcmpss_avx512f(auVar14,ZEXT416(0),0);
      bVar6 = (bool)((byte)uVar5 & 1);
      fVar12 = (float)((uint)bVar6 * 0x3f800000 + (uint)!bVar6 * auVar14._0_4_);
      if (0 < iVar7) {
        fVar15 = 1.0 / fVar12;
        iVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
        iVar8 = iVar11;
        do {
          pfVar1 = destP + iVar8;
          auVar14._0_4_ = fVar15 * *pfVar1;
          auVar14._4_4_ = fVar15 * pfVar1[1];
          auVar14._8_4_ = fVar15 * pfVar1[2];
          auVar14._12_4_ = fVar15 * pfVar1[3];
          *(undefined1 (*) [16])(destP + iVar8) = auVar14;
          iVar8 = iVar8 + iVar9 * 4;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      local_38 = (uint)lVar4;
      if ((local_38 >> 10 & 1) == 0) {
        scaleFactors[lVar10] = fVar12;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar13 = log((double)fVar12);
          fVar12 = (float)(dVar13 + (double)cumulativeScaleFactors[lVar10]);
LAB_0013a0b3:
          cumulativeScaleFactors[lVar10] = fVar12;
        }
      }
      else {
        dVar13 = log((double)fVar12);
        scaleFactors[lVar10] = (float)dVar13;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar12 = (float)dVar13 + cumulativeScaleFactors[lVar10];
          goto LAB_0013a0b3;
        }
      }
      lVar10 = lVar10 + 1;
      iVar11 = iVar11 + 4;
    } while (lVar10 != iVar2);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(
                                                                    REALTYPE* destP,
                                                                    REALTYPE* scaleFactors,
                                                                    REALTYPE* cumulativeScaleFactors,
                                                                    const int fillWithOnes,
                                                                    const int partitionIndex) {

    bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    for (int k = startPattern; k < endPattern; k++) {
      REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
      #pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
      #pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}